

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_x86_avx.cpp
# Opt level: O1

int __thiscall ncnn::Convolution_x86_avx::destroy_pipeline(Convolution_x86_avx *this,Option *opt)

{
  Layer *pLVar1;
  
  pLVar1 = this->activation;
  if (pLVar1 != (Layer *)0x0) {
    (*pLVar1->_vptr_Layer[5])(pLVar1,opt);
    if (this->activation != (Layer *)0x0) {
      (*this->activation->_vptr_Layer[1])();
    }
    this->activation = (Layer *)0x0;
  }
  pLVar1 = this->convolution_dilation1;
  if (pLVar1 != (Layer *)0x0) {
    (*pLVar1->_vptr_Layer[5])(pLVar1,opt);
    if (this->convolution_dilation1 != (Layer *)0x0) {
      (*this->convolution_dilation1->_vptr_Layer[1])();
    }
    this->convolution_dilation1 = (Layer *)0x0;
  }
  return 0;
}

Assistant:

int Convolution_x86_avx::destroy_pipeline(const Option& opt)
{
    if (activation)
    {
        activation->destroy_pipeline(opt);
        delete activation;
        activation = 0;
    }

    if (convolution_dilation1)
    {
        convolution_dilation1->destroy_pipeline(opt);
        delete convolution_dilation1;
        convolution_dilation1 = 0;
    }

    return 0;
}